

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O1

int logger_st_test(void)

{
  uint uVar1;
  long *plVar2;
  SimpleLogger *this;
  size_type *psVar3;
  int iVar4;
  string filename;
  string prefix;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"logger_st_test","");
  TestSuite::clearTestFile(&local_70,MIDDLE_OF_TEST);
  TestSuite::getTestFileName(&local_50,&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(this,&local_90,0x80,0x2000000,0x10);
  SimpleLogger::start(this);
  SimpleLogger::setLogLevel(this,6);
  std::chrono::_V2::system_clock::now();
  uVar1 = rand();
  uVar1 = uVar1 & 0xffffff;
  iVar4 = 1;
  if (((0xf < uVar1) && (iVar4 = 2, 0x1f < uVar1)) && (iVar4 = 3, 0x7f < uVar1)) {
    iVar4 = 5 - (uint)(uVar1 < 0x200);
  }
  iVar4 = (*(code *)((long)&DAT_00110040 + (long)(int)(&DAT_00110040)[iVar4 - 1]))();
  return iVar4;
}

Assistant:

int logger_reclaim_test(uint64_t num) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    uint64_t ii=0;
    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num/2; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}